

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_buffer_pointerv(NegativeTestContext *ctx)

{
  allocator<char> local_45;
  GLuint buf;
  GLvoid *params;
  string local_38;
  
  params = (GLvoid *)0x0;
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&buf);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8892,buf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not an accepted value.",&local_45);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glGetBufferPointerv(&ctx->super_CallLogWrapper,0x8892,0xffffffff,&params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetBufferPointerv(&ctx->super_CallLogWrapper,0xffffffff,0x88bd,&params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if the reserved buffer object name 0 is bound to target."
             ,&local_45);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glGetBufferPointerv(&ctx->super_CallLogWrapper,0x8892,0x88bd,&params);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&buf);
  return;
}

Assistant:

void get_buffer_pointerv (NegativeTestContext& ctx)
{
	GLvoid*	params	= DE_NULL;
	GLuint	buf;
	ctx.glGenBuffers(1, &buf);
	ctx.glBindBuffer(GL_ARRAY_BUFFER, buf);

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not an accepted value.");
	ctx.glGetBufferPointerv(GL_ARRAY_BUFFER, -1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetBufferPointerv(-1, GL_BUFFER_MAP_POINTER, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the reserved buffer object name 0 is bound to target.");
	ctx.glBindBuffer(GL_ARRAY_BUFFER, 0);
	ctx.glGetBufferPointerv(GL_ARRAY_BUFFER, GL_BUFFER_MAP_POINTER, &params);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteBuffers(1, &buf);
}